

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::minF64x2(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *this_00;
  Literal *this_01;
  long lVar1;
  undefined1 local_c0 [8];
  LaneArray<2> other_lanes;
  Literal local_78;
  undefined1 local_60 [8];
  LaneArray<2> lanes;
  
  getLanesF64x2((LaneArray<2> *)local_60,this);
  getLanesF64x2((LaneArray<2> *)local_c0,other);
  lVar1 = 0;
  this_00 = &other_lanes._M_elems[1].type;
  do {
    this_01 = (Literal *)(local_60 + lVar1);
    min(&local_78,this_01,(Literal *)(local_c0 + lVar1));
    Literal((Literal *)this_00,&local_78);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_78);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 == 0x18);
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_60);
  lVar1 = 0x18;
  do {
    ~Literal((Literal *)(local_c0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x18;
  do {
    ~Literal((Literal *)(local_60 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::minF64x2(const Literal& other) const {
  return binary<2, &Literal::getLanesF64x2, &Literal::min>(*this, other);
}